

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_stack.h
# Opt level: O0

double __thiscall
mvm::value_stack<mvm::list::mplist<double>_>::pop<double>
          (value_stack<mvm::list::mplist<double>_> *this)

{
  bool bVar1;
  mexcept *this_00;
  reference pvVar2;
  double dVar3;
  value_type val;
  allocator<char> local_31;
  string local_30;
  value_stack<mvm::list::mplist<double>_> *local_10;
  value_stack<mvm::list::mplist<double>_> *this_local;
  
  local_10 = this;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(&this->m_stack);
  if (!bVar1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::back(&this->m_stack);
    dVar3 = *pvVar2;
    std::vector<double,_std::allocator<double>_>::pop_back(&this->m_stack);
    dVar3 = traits::value_stack_traits<mvm::list::mplist<double>,_1UL>::get_val<double>(dVar3);
    return dVar3;
  }
  this_00 = (mexcept *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"[-][mvm] try to pop from empty stack",&local_31);
  mexcept::mexcept(this_00,&local_30,POP_EMPTY_STACK);
  __cxa_throw(this_00,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

T pop() {
    if (m_stack.empty()) {
      throw mexcept("[-][mvm] try to pop from empty stack",
                    status_type::POP_EMPTY_STACK);
    }
    auto val = m_stack.back();
    m_stack.pop_back();
    LOG_INFO("value_stack -> pop from stack[" << this << "]");
    return value_stack_traits::template get_val<T>(std::move(val));
  }